

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_str_send(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  nni_msg *msg_00;
  size_t sVar2;
  void *pvVar3;
  ws_frame *frame_00;
  undefined1 local_68 [8];
  nni_iov iov [2];
  uint local_3c;
  uint niov;
  nni_msg *msg;
  ws_frame *frame;
  int rv;
  nni_ws *ws;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  if ((*(byte *)((long)arg + 0x55) & 1) == 0) {
    msg_00 = nni_aio_get_msg(aio);
    if (msg_00 == (nni_msg *)0x0) {
      nni_aio_finish_error(aio,NNG_EINVAL);
      return;
    }
    sVar2 = nng_msg_header_len(msg_00);
    if (sVar2 != 0) {
      iov[0].iov_buf = (void *)nni_msg_header_len(msg_00);
      local_68 = (undefined1  [8])nni_msg_header(msg_00);
    }
    local_3c = (uint)(sVar2 != 0);
    pvVar3 = (void *)nni_msg_len(msg_00);
    iov[local_3c].iov_buf = pvVar3;
    pvVar3 = nni_msg_body(msg_00);
    iov[(ulong)local_3c - 1].iov_len = (size_t)pvVar3;
    nni_aio_set_iov(aio,local_3c + 1,(nni_iov *)local_68);
  }
  frame_00 = (ws_frame *)nni_zalloc(0xd8);
  if (frame_00 == (ws_frame *)0x0) {
    nni_aio_finish_error(aio,NNG_ENOMEM);
  }
  else {
    frame_00->aio = aio;
    result = ws_frame_prep_tx((nni_ws *)arg,frame_00);
    if (result == NNG_OK) {
      nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
      if ((*(byte *)((long)arg + 0x51) & 1) == 0) {
        _Var1 = nni_aio_start(aio,ws_write_cancel,arg);
        if (_Var1) {
          nni_aio_set_prov_data(aio,frame_00);
          nni_list_append((nni_list *)((long)arg + 0x88),aio);
          nni_list_append((nni_list *)((long)arg + 0xb8),frame_00);
          ws_start_write((nni_ws *)arg);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        }
        else {
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          ws_frame_fini(frame_00);
        }
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        nni_aio_finish_error(aio,NNG_ECLOSED);
        ws_frame_fini(frame_00);
      }
    }
    else {
      nni_aio_finish_error(aio,result);
      ws_frame_fini(frame_00);
    }
  }
  return;
}

Assistant:

static void
ws_str_send(void *arg, nni_aio *aio)
{
	nni_ws   *ws = arg;
	int       rv;
	ws_frame *frame;

	nni_aio_reset(aio);

	if (!ws->isstream) {
		nni_msg *msg;
		unsigned niov;
		nni_iov  iov[2];
		if ((msg = nni_aio_get_msg(aio)) == NULL) {
			nni_aio_finish_error(aio, NNG_EINVAL);
			return;
		}
		niov = 0;
		if (nng_msg_header_len(msg) > 0) {
			iov[niov].iov_len = nni_msg_header_len(msg);
			iov[niov].iov_buf = nni_msg_header(msg);
			niov++;
		}
		iov[niov].iov_len = nni_msg_len(msg);
		iov[niov].iov_buf = nni_msg_body(msg);
		niov++;

		// Scribble into the iov for now.
		nni_aio_set_iov(aio, niov, iov);
	}

	if ((frame = NNI_ALLOC_STRUCT(frame)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}
	frame->aio = aio;
	if ((rv = ws_frame_prep_tx(ws, frame)) != 0) {
		nni_aio_finish_error(aio, rv);
		ws_frame_fini(frame);
		return;
	}

	nni_mtx_lock(&ws->mtx);

	if (ws->closed) {
		nni_mtx_unlock(&ws->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		ws_frame_fini(frame);
		return;
	}
	if (!nni_aio_start(aio, ws_write_cancel, ws)) {
		nni_mtx_unlock(&ws->mtx);
		ws_frame_fini(frame);
		return;
	}
	nni_aio_set_prov_data(aio, frame);
	nni_list_append(&ws->sendq, aio);
	nni_list_append(&ws->txq, frame);
	ws_start_write(ws);
	nni_mtx_unlock(&ws->mtx);
}